

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_reserve.c
# Opt level: O0

mpt_command * mpt_command_reserve(mpt_array *arr,size_t max)

{
  long *plVar1;
  mpt_buffer *pmVar2;
  ulong uVar3;
  mpt_buffer *cmd_00;
  _mpt_vptr_buffer **pp_Var4;
  mpt_command *pmVar5;
  mpt_buffer *local_58;
  uintptr_t mid;
  size_t used;
  size_t len;
  size_t i;
  mpt_command *cmd;
  mpt_command *base;
  mpt_buffer *msg;
  size_t max_local;
  mpt_array *arr_local;
  
  i = 0;
  mid = 0;
  local_58 = (mpt_buffer *)0x0;
  switch(max) {
  case 0:
    return (mpt_command *)0x0;
  case 1:
    msg = (mpt_buffer *)0x7f;
    break;
  case 2:
    msg = (mpt_buffer *)0x7fff;
    break;
  case 3:
    msg = (mpt_buffer *)0x7fffff;
    break;
  case 4:
    msg = (mpt_buffer *)0x7fffffff;
    break;
  case 5:
    msg = (mpt_buffer *)0x7fffffffff;
    break;
  case 6:
    msg = (mpt_buffer *)0x7fffffffffff;
    break;
  case 7:
    msg = (mpt_buffer *)0x7fffffffffffff;
    break;
  default:
    msg = (mpt_buffer *)0x7fffffffffffffff;
  }
  if ((mpt_buffer *)0x7fffffffffffffff < msg) {
    msg = (mpt_buffer *)0x7fffffffffffffff;
  }
  pmVar2 = arr->_buf;
  if (pmVar2 == (mpt_buffer *)0x0) {
    arr_local = (mpt_array *)mpt_array_append(arr,0xc0,(void *)0x0);
    if (arr_local != (mpt_array *)0x0) {
      arr_local->_buf = (mpt_buffer *)0x1;
      arr_local[1]._buf = (mpt_buffer *)log_reply;
      arr_local[2]._buf = (mpt_buffer *)0x1;
    }
  }
  else {
    uVar3 = pmVar2->_used;
    cmd_00 = pmVar2 + 1;
    for (len = 0; len < uVar3 / 0x18; len = len + 1) {
      if (local_58 < (&cmd_00->_vptr)[len * 3]) {
        local_58 = (mpt_buffer *)(&cmd_00->_vptr)[len * 3];
      }
      pp_Var4 = (_mpt_vptr_buffer **)i;
      if ((&cmd_00->_content_traits)[len * 3] == (mpt_type_traits *)0x0) {
        if (i == 0) {
          pp_Var4 = &cmd_00->_vptr + len * 3;
        }
      }
      else {
        mid = mid + 1;
        if (i != 0) {
          pp_Var4 = &cmd_00->_vptr + len * 3;
          *(_mpt_vptr_buffer **)i = *pp_Var4;
          *(mpt_type_traits **)(i + 8) = (mpt_type_traits *)pp_Var4[1];
          *(_mpt_vptr_buffer **)(i + 0x10) = pp_Var4[2];
          (&cmd_00->_content_traits)[len * 3] = (mpt_type_traits *)0x0;
          do {
            pp_Var4 = (_mpt_vptr_buffer **)(i + 0x18);
            if (&cmd_00->_vptr + len * 3 <= pp_Var4) break;
            plVar1 = (long *)(i + 0x20);
            i = (size_t)pp_Var4;
          } while (*plVar1 != 0);
        }
      }
      i = (size_t)pp_Var4;
    }
    pmVar2->_used = mid * 0x18;
    local_58 = (mpt_buffer *)((long)&local_58->_vptr + 1);
    if (msg < local_58) {
      for (len = 1; len <= msg; len = len + 1) {
        pmVar5 = mpt_command_find((mpt_command *)cmd_00,mid,len);
        if (pmVar5 == (mpt_command *)0x0) {
          local_58 = (mpt_buffer *)len;
          break;
        }
      }
      if (msg < len) {
        return (mpt_command *)0x0;
      }
    }
    arr_local = (mpt_array *)mpt_array_append(arr,0x18,(void *)0x0);
    if (arr_local == (mpt_array *)0x0) {
      arr_local = (mpt_array *)0x0;
    }
    else {
      arr_local->_buf = local_58;
      arr_local[1]._buf = (mpt_buffer *)log_reply;
      arr_local[2]._buf = local_58;
    }
  }
  return (mpt_command *)arr_local;
}

Assistant:

extern MPT_STRUCT(command) *mpt_command_reserve(MPT_STRUCT(array) *arr, size_t max)
{
	MPT_STRUCT(buffer) *msg;
	MPT_STRUCT(command) *base, *cmd = 0;
	size_t i, len, used = 0;
	uintptr_t mid = 0;
	
	
	switch (max) {
	  case 0: return 0;
	  case 1: max = INT8_MAX; break;
	  case 2: max = INT16_MAX; break;
	  case 3: max = INT32_MAX/0x100; break;
	  case 4: max = INT32_MAX; break;
	  case 5: max = INT64_MAX/0x1000000; break;
	  case 6: max = INT64_MAX/0x10000; break;
	  case 7: max = INT64_MAX/0x100; break;
	  default: max = INT64_MAX;
	}
	if (max > INTPTR_MAX) {
		max = INTPTR_MAX;
	}
	/* command data on buffer */
	if ((msg = arr->_buf)) {
		len  = msg->_used / sizeof(*cmd);
		base = (void *) (msg+1);
	} else {
		if ((cmd = mpt_array_append(arr, sizeof(*cmd) * 8, 0))) {
			static const uintptr_t firstId = 1;
			cmd->id  = firstId;
			cmd->cmd = log_reply;
			cmd->arg = (void *) firstId;
		}
		return cmd;
	}
	for (i = 0; i < len; ++i) {
		/* find highest previous id */
		if (base[i].id > mid) {
			mid = base[i].id;
		}
		/* save available space */
		if (!base[i].cmd) {
			if (!cmd) {
				cmd = base+i;
			}
			continue;
		}
		/* track number of active commands */
		++used;
		
		/* no smaller position available */
		if (!cmd) continue;
		
		/* move command entry */
		*cmd = base[i];
		base[i].cmd = 0;
		
		/* find smallest free position */
		while (++cmd < (base+i)) {
			if (!cmd->cmd) {
				break;
			}
		}
	}
	/* save used size */
	msg->_used = used * sizeof(*cmd);
	
	/* try to find low free id */
	if (++mid > max) {
		for (i = 1; i <= max; ++i) {
			if (!mpt_command_find(base, used, i)) {
				mid = i;
				break;
			}
		}
		/* no unique message id available */
		if (i > max) {
			return 0;
		}
	}
	/* add command slot */
	if (!(cmd = mpt_array_append(arr, sizeof(*cmd), 0))) {
		return 0;
	}
	
	/* setup default handling */
	cmd->id  = mid;
	cmd->cmd = log_reply;
	cmd->arg = (void *) mid;
	
	return cmd;
}